

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_rdhwr(DisasContext_conflict6 *ctx,int rt,int rd,int sel)

{
  TCGContext_conflict6 *s;
  TCGv_i64 pTVar1;
  TCGContext_conflict6 *tcg_ctx;
  uintptr_t o_2;
  TCGTemp *a1;
  TCGv_i32 pTVar2;
  code *func;
  uintptr_t o;
  TCGv_i64 pTVar3;
  TCGTemp *args [1];
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  s = ctx->uc->tcg_ctx;
  if ((ctx->insn_flags & 0x40) == 0) {
    generate_exception_err(ctx,0x14,0);
  }
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  pTVar3 = (TCGv_i64)((long)a1 - (long)s);
  switch(rd) {
  case 0:
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    func = helper_rdhwr_cpunum_mips64el;
    break;
  case 1:
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    func = helper_rdhwr_synci_step_mips64el;
    break;
  case 2:
    if ((((ctx->base).tb)->cflags & 0x20000) != 0) {
      pTVar2 = tcg_const_i32_mips64el(s,1);
      tcg_gen_op3_mips64el
                (s,INDEX_op_st_i32,(TCGArg)(pTVar2 + (long)s),(TCGArg)(s->cpu_env + (long)s),
                 0xfffffffffffff48c);
      tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar2 + (long)s));
    }
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    tcg_gen_callN_mips64el
              (s,helper_rdhwr_cc_mips64el,(TCGTemp *)((long)s + (long)pTVar3),1,&local_48);
    if ((rt != 0) && (s->cpu_gpr[rt] != pTVar3)) {
      tcg_gen_op2_mips64el
                (s,INDEX_op_mov_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[rt]),(TCGArg)a1);
    }
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)(s->cpu_pc + (long)s),(ctx->base).pc_next + 4);
    (ctx->base).is_jmp = DISAS_TARGET_1;
    goto LAB_0099f8a9;
  case 3:
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    func = helper_rdhwr_ccres_mips64el;
    break;
  case 4:
    if ((ctx->insn_flags & 0x2000) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    if (sel != 0) {
      tcg_ctx = ctx->uc->tcg_ctx;
      pTVar2 = tcg_const_i32_mips64el(tcg_ctx,0x14);
      local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_40 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
      tcg_gen_callN_mips64el(tcg_ctx,helper_raise_exception_mips64el,(TCGTemp *)0x0,2,&local_48);
      tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    }
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    func = helper_rdhwr_performance_mips64el;
    break;
  case 5:
    if ((ctx->insn_flags & 0x2000) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    func = helper_rdhwr_xnp_mips64el;
    break;
  default:
    if ((rd != 0x1d) || ((ctx->hflags & 0x200010) == 0)) {
      generate_exception_err(ctx,0x14,0);
      goto LAB_0099f8a9;
    }
    tcg_gen_op3_mips64el(s,INDEX_op_ld_i64,(TCGArg)a1,(TCGArg)(s->cpu_env + (long)s),0x1a0);
    if ((rt == 0) || (pTVar1 = s->cpu_gpr[rt], pTVar1 == pTVar3)) goto LAB_0099f8a9;
    goto LAB_0099f8a4;
  }
  tcg_gen_callN_mips64el(s,func,(TCGTemp *)((long)s + (long)pTVar3),1,&local_48);
  if ((rt != 0) && (pTVar1 = s->cpu_gpr[rt], pTVar1 != pTVar3)) {
LAB_0099f8a4:
    tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)((long)&s->pool_cur + (long)pTVar1),(TCGArg)a1);
  }
LAB_0099f8a9:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar3 + (long)s));
  return;
}

Assistant:

static void gen_rdhwr(DisasContext *ctx, int rt, int rd, int sel)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;

    /*
     * The Linux kernel will emulate rdhwr if it's not supported natively.
     * Therefore only check the ISA in system mode.
     */
    check_insn(ctx, ISA_MIPS32R2);
    t0 = tcg_temp_new(tcg_ctx);

    switch (rd) {
    case 0:
        gen_helper_rdhwr_cpunum(tcg_ctx, t0, tcg_ctx->cpu_env);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case 1:
        gen_helper_rdhwr_synci_step(tcg_ctx, t0, tcg_ctx->cpu_env);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case 2:
        if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
            gen_io_start(tcg_ctx);
        }
        gen_helper_rdhwr_cc(tcg_ctx, t0, tcg_ctx->cpu_env);
        gen_store_gpr(tcg_ctx, t0, rt);
        /*
         * Break the TB to be able to take timer interrupts immediately
         * after reading count. DISAS_STOP isn't sufficient, we need to ensure
         * we break completely out of translated code.
         */
        gen_save_pc(tcg_ctx, ctx->base.pc_next + 4);
        ctx->base.is_jmp = DISAS_EXIT;
        break;
    case 3:
        gen_helper_rdhwr_ccres(tcg_ctx, t0, tcg_ctx->cpu_env);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case 4:
        check_insn(ctx, ISA_MIPS32R6);
        if (sel != 0) {
            /*
             * Performance counter registers are not implemented other than
             * control register 0.
             */
            generate_exception(ctx, EXCP_RI);
        }
        gen_helper_rdhwr_performance(tcg_ctx, t0, tcg_ctx->cpu_env);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case 5:
        check_insn(ctx, ISA_MIPS32R6);
        gen_helper_rdhwr_xnp(tcg_ctx, t0, tcg_ctx->cpu_env);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case 29:
        if ((ctx->hflags & MIPS_HFLAG_CP0) ||
            (ctx->hflags & MIPS_HFLAG_HWRENA_ULR)) {
            tcg_gen_ld_tl(tcg_ctx, t0, tcg_ctx->cpu_env,
                          offsetof(CPUMIPSState, active_tc.CP0_UserLocal));
            gen_store_gpr(tcg_ctx, t0, rt);
        } else {
            generate_exception_end(ctx, EXCP_RI);
        }
        break;
    default:            /* Invalid */
        MIPS_INVAL("rdhwr");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
    tcg_temp_free(tcg_ctx, t0);
}